

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::InitializeGlobalObject(ScriptContext *this)

{
  GlobalObject *this_00;
  
  this_00 = GlobalObject::New(this);
  Memory::Recycler::RootAddRef(this->recycler,this_00,(uint *)0x0);
  (this->super_ScriptContextBase).globalObject = this_00;
  GlobalObject::Initialize(this_00,this);
  ThreadContext::RegisterScriptContext(this->threadContext,this);
  return;
}

Assistant:

void ScriptContext::InitializeGlobalObject()
    {
        GlobalObject * localGlobalObject = GlobalObject::New(this);
        GetRecycler()->RootAddRef(localGlobalObject);

        // Assigned the global Object after we have successfully AddRef (in case of OOM)
        globalObject = localGlobalObject;
        globalObject->Initialize(this);

        this->GetThreadContext()->RegisterScriptContext(this);
    }